

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int passphrase_cb(char *buf,int size,int rwflag,void *passphrase)

{
  size_t sVar1;
  int local_24;
  int passphrase_len;
  void *passphrase_local;
  int rwflag_local;
  int size_local;
  char *buf_local;
  
  sVar1 = strlen((char *)passphrase);
  local_24 = (int)sVar1;
  if (size + -1 < local_24) {
    local_24 = size + -1;
  }
  memcpy(buf,passphrase,(long)local_24);
  buf[local_24] = '\0';
  return local_24;
}

Assistant:

static int
passphrase_cb(char *buf, int size, int rwflag, void *passphrase)
{
    int passphrase_len = (int) strlen(passphrase);

    (void)rwflag;

    if(passphrase_len > (size - 1)) {
        passphrase_len = size - 1;
    }
    memcpy(buf, passphrase, passphrase_len);
    buf[passphrase_len] = '\0';

    return passphrase_len;
}